

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_EAX;
  int iVar12;
  uint uVar13;
  parasail_result_t *ppVar14;
  __m128i *ptr;
  __m128i *palVar15;
  __m128i *ptr_00;
  int32_t *ptr_01;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  __m128i *ptr_02;
  char *pcVar20;
  int32_t iVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  char *__format;
  int iVar27;
  int iVar28;
  long lVar29;
  __m128i *palVar30;
  long lVar31;
  int iVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i alVar43;
  undefined1 auVar44 [16];
  __m128i_32_t A;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar66;
  int iVar67;
  undefined1 auVar62 [16];
  int iVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  __m128i alVar65;
  int iVar69;
  int iVar71;
  int iVar72;
  int iVar73;
  undefined1 auVar70 [16];
  __m128i vH;
  int32_t in_stack_fffffffffffffe58;
  __m128i_32_t e;
  __m128i_32_t h;
  ulong uVar33;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile";
  }
  else {
    pvVar2 = (profile->profile32).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar20 = "profile->profile32.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar20 = "profile->matrix";
      }
      else {
        uVar19 = profile->s1Len;
        if ((int)uVar19 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar20 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "open";
        }
        else {
          if (-1 < gap) {
            uVar8 = uVar19 - 1;
            uVar25 = (ulong)uVar19 + 3 >> 2;
            uVar33 = (ulong)uVar8 % uVar25;
            iVar12 = (int)(uVar8 / uVar25);
            iVar27 = -open;
            iVar9 = ppVar3->min;
            uVar24 = 0x80000000 - iVar9;
            if (iVar9 != iVar27 && SBORROW4(iVar9,iVar27) == iVar9 + open < 0) {
              uVar24 = open | 0x80000000;
            }
            iVar9 = 0x7ffffffe - ppVar3->max;
            ppVar14 = parasail_result_new_table1((uint)((ulong)uVar19 + 3) & 0x7ffffffc,s2Len);
            if (ppVar14 != (parasail_result_t *)0x0) {
              ppVar14->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar14->flag | 0x4420802;
              ptr = parasail_memalign___m128i(0x10,uVar25);
              palVar15 = parasail_memalign___m128i(0x10,uVar25);
              ptr_00 = parasail_memalign___m128i(0x10,uVar25);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              auVar59._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
              auVar59._4_4_ = -(uint)((int)palVar15 == 0 && (int)((ulong)palVar15 >> 0x20) == 0);
              auVar59._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
              auVar59._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              iVar16 = movmskps((int)palVar15,auVar59);
              uVar22 = 0;
              if (iVar16 == 0) {
                iVar10 = s2Len + -1;
                iVar17 = 3 - iVar12;
                iVar32 = uVar24 + 1;
                uVar24 = (uint)uVar25;
                palVar30 = (__m128i *)(ulong)(uint)s2Len;
                iVar16 = iVar27;
                for (; uVar22 != uVar25; uVar22 = uVar22 + 1) {
                  iVar28 = iVar16;
                  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
                    iVar11 = 0;
                    if (s1_beg == 0) {
                      iVar11 = iVar28;
                    }
                    *(int *)((long)&h + lVar29 * 4) = iVar11;
                    lVar31 = (long)iVar11 - (ulong)(uint)open;
                    if (lVar31 < -0x7fffffff) {
                      lVar31 = -0x80000000;
                    }
                    *(int *)((long)&e + lVar29 * 4) = (int)lVar31;
                    iVar28 = iVar28 - gap * uVar24;
                  }
                  ptr[uVar22][0] = h.m[0];
                  ptr[uVar22][1] = h.m[1];
                  ptr_00[uVar22][0] = e.m[0];
                  ptr_00[uVar22][1] = e.m[1];
                  iVar16 = iVar16 - gap;
                  palVar30 = ptr_00;
                }
                *ptr_01 = 0;
                iVar16 = iVar27;
                for (uVar22 = 1; s2Len + 1 != uVar22; uVar22 = uVar22 + 1) {
                  iVar21 = 0;
                  if (s2_beg == 0) {
                    iVar21 = iVar16;
                  }
                  ptr_01[uVar22] = iVar21;
                  iVar16 = iVar16 - gap;
                }
                uVar22 = 0;
                auVar38._4_4_ = iVar9;
                auVar38._0_4_ = iVar9;
                auVar38._8_4_ = iVar9;
                auVar38._12_4_ = iVar9;
                auVar48._4_4_ = iVar32;
                auVar48._0_4_ = iVar32;
                auVar48._8_4_ = iVar32;
                auVar48._12_4_ = iVar32;
                auVar51 = auVar48;
                auVar59 = auVar48;
                iVar16 = iVar10;
                do {
                  ptr_02 = palVar15;
                  if (uVar22 == (uint)s2Len) {
                    iVar12 = iVar32;
                    if (s2_end != 0) {
                      for (iVar12 = 0; iVar12 < iVar17; iVar12 = iVar12 + 1) {
                        lVar29 = auVar51._8_8_;
                        uVar25 = auVar51._0_8_;
                        auVar51._0_8_ = uVar25 << 0x20;
                        auVar51._8_8_ = lVar29 << 0x20 | uVar25 >> 0x20;
                      }
                      iVar12 = auVar51._12_4_;
                    }
                    palVar15 = ptr_02;
                    uVar13 = uVar8;
                    if (s1_end != 0) {
                      uVar18 = (uVar24 & 0x1fffffff) << 2;
                      for (uVar25 = 0; palVar15 = (__m128i *)(ulong)uVar18, uVar18 != (uint)uVar25;
                          uVar25 = uVar25 + 1) {
                        uVar26 = ((uint)uVar25 & 3) * uVar24 + ((uint)(uVar25 >> 2) & 0x3fffffff);
                        iVar27 = iVar16;
                        iVar28 = iVar12;
                        uVar7 = uVar13;
                        if (((int)uVar26 < (int)uVar19) &&
                           (iVar11 = *(int *)((long)*ptr + uVar25 * 4), iVar27 = iVar10,
                           iVar28 = iVar11, uVar7 = uVar26, iVar11 <= iVar12)) {
                          if ((int)uVar13 <= (int)uVar26) {
                            uVar26 = uVar13;
                          }
                          iVar27 = iVar16;
                          iVar28 = iVar12;
                          uVar7 = uVar13;
                          if (iVar16 == iVar10 && iVar11 == iVar12) {
                            uVar7 = uVar26;
                          }
                        }
                        uVar13 = uVar7;
                        iVar12 = iVar28;
                        iVar16 = iVar27;
                      }
                    }
                    uVar19 = (uint)palVar15;
                    if (s2_end == 0 && s1_end == 0) {
                      alVar43 = ptr[uVar33];
                      for (iVar12 = 0; lVar29 = alVar43[1], iVar12 < iVar17; iVar12 = iVar12 + 1) {
                        uVar33 = alVar43[0];
                        alVar43[0] = uVar33 << 0x20;
                        alVar43[1] = lVar29 << 0x20 | uVar33 >> 0x20;
                      }
                      iVar12 = alVar43[1]._4_4_;
                      iVar16 = iVar10;
                      uVar13 = uVar8;
                      uVar19 = uVar8;
                    }
                    auVar44._0_4_ = -(uint)(auVar38._0_4_ < iVar32);
                    auVar44._4_4_ = -(uint)(auVar38._4_4_ < iVar32);
                    auVar44._8_4_ = -(uint)(auVar38._8_4_ < iVar32);
                    auVar44._12_4_ = -(uint)(auVar38._12_4_ < iVar32);
                    auVar60._0_4_ = -(uint)(iVar9 < auVar59._0_4_);
                    auVar60._4_4_ = -(uint)(iVar9 < auVar59._4_4_);
                    auVar60._8_4_ = -(uint)(iVar9 < auVar59._8_4_);
                    auVar60._12_4_ = -(uint)(iVar9 < auVar59._12_4_);
                    iVar9 = movmskps(uVar19,auVar60 | auVar44);
                    if (iVar9 != 0) {
                      *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                      iVar12 = 0;
                      iVar16 = 0;
                      uVar13 = 0;
                    }
                    ppVar14->score = iVar12;
                    ppVar14->end_query = uVar13;
                    ppVar14->end_ref = iVar16;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr);
                    return ppVar14;
                  }
                  iVar28 = ppVar3->mapper[(byte)s2[uVar22]];
                  palVar15 = ptr + (uVar24 - 1);
                  auVar4._4_8_ = auVar48._8_8_;
                  auVar4._0_4_ = (int)(*palVar15)[0];
                  auVar34._0_8_ = auVar4._0_8_ << 0x20;
                  auVar34._8_4_ = *(undefined4 *)((long)*palVar15 + 4);
                  auVar34._12_4_ = (int)(*palVar15)[1];
                  auVar46._4_12_ = auVar34._4_12_;
                  auVar46._0_4_ = ptr_01[uVar22];
                  lVar29 = 0;
                  auVar54._4_4_ = iVar32;
                  auVar54._0_4_ = iVar32;
                  auVar54._8_4_ = iVar32;
                  auVar54._12_4_ = iVar32;
                  for (uVar23 = 0; iVar21 = (int32_t)uVar22, uVar25 != uVar23; uVar23 = uVar23 + 1)
                  {
                    piVar1 = (int *)((long)pvVar2 + lVar29 + (long)(int)(iVar28 * uVar24) * 0x10);
                    auVar35._0_4_ = auVar46._0_4_ + *piVar1;
                    auVar35._4_4_ = auVar46._4_4_ + piVar1[1];
                    auVar35._8_4_ = auVar46._8_4_ + piVar1[2];
                    auVar35._12_4_ = auVar46._12_4_ + piVar1[3];
                    auVar48 = *(undefined1 (*) [16])((long)*ptr_00 + lVar29);
                    iVar69 = auVar48._0_4_;
                    auVar45._0_4_ = -(uint)(iVar69 < auVar35._0_4_);
                    iVar71 = auVar48._4_4_;
                    auVar45._4_4_ = -(uint)(iVar71 < auVar35._4_4_);
                    iVar72 = auVar48._8_4_;
                    auVar45._8_4_ = -(uint)(iVar72 < auVar35._8_4_);
                    iVar73 = auVar48._12_4_;
                    auVar45._12_4_ = -(uint)(iVar73 < auVar35._12_4_);
                    auVar46 = ~auVar45 & auVar48 | auVar35 & auVar45;
                    iVar11 = auVar54._0_4_;
                    auVar62._0_4_ = -(uint)(iVar11 < auVar46._0_4_);
                    iVar56 = auVar54._4_4_;
                    auVar62._4_4_ = -(uint)(iVar56 < auVar46._4_4_);
                    iVar57 = auVar54._8_4_;
                    auVar62._8_4_ = -(uint)(iVar57 < auVar46._8_4_);
                    iVar58 = auVar54._12_4_;
                    auVar62._12_4_ = -(uint)(iVar58 < auVar46._12_4_);
                    auVar46 = ~auVar62 & auVar54 | auVar46 & auVar62;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar29) = auVar46;
                    iVar61 = auVar46._0_4_;
                    auVar36._0_4_ = -(uint)(iVar61 < auVar59._0_4_);
                    iVar66 = auVar46._4_4_;
                    auVar36._4_4_ = -(uint)(iVar66 < auVar59._4_4_);
                    iVar67 = auVar46._8_4_;
                    auVar36._8_4_ = -(uint)(iVar67 < auVar59._8_4_);
                    iVar68 = auVar46._12_4_;
                    auVar36._12_4_ = -(uint)(iVar68 < auVar59._12_4_);
                    auVar59 = auVar59 & auVar36 | ~auVar36 & auVar46;
                    auVar37._0_4_ = -(uint)(iVar61 < auVar38._0_4_);
                    auVar37._4_4_ = -(uint)(iVar66 < auVar38._4_4_);
                    auVar37._8_4_ = -(uint)(iVar67 < auVar38._8_4_);
                    auVar37._12_4_ = -(uint)(iVar68 < auVar38._12_4_);
                    auVar38 = ~auVar37 & auVar38 | auVar46 & auVar37;
                    auVar47._0_4_ = -(uint)(iVar69 < auVar38._0_4_);
                    auVar47._4_4_ = -(uint)(iVar71 < auVar38._4_4_);
                    auVar47._8_4_ = -(uint)(iVar72 < auVar38._8_4_);
                    auVar47._12_4_ = -(uint)(iVar73 < auVar38._12_4_);
                    auVar48 = ~auVar47 & auVar38 | auVar48 & auVar47;
                    auVar52._0_4_ = -(uint)(iVar11 < auVar48._0_4_);
                    auVar52._4_4_ = -(uint)(iVar56 < auVar48._4_4_);
                    auVar52._8_4_ = -(uint)(iVar57 < auVar48._8_4_);
                    auVar52._12_4_ = -(uint)(iVar58 < auVar48._12_4_);
                    auVar38 = ~auVar52 & auVar48 | auVar54 & auVar52;
                    alVar65[0] = uVar23 & 0xffffffff;
                    alVar65[1] = uVar25;
                    arr_store_si128(((ppVar14->field_4).rowcols)->score_row,alVar65,iVar21,s2Len,
                                    (int32_t)palVar30,in_stack_fffffffffffffe58);
                    auVar70._0_4_ = iVar61 - open;
                    auVar70._4_4_ = iVar66 - open;
                    auVar70._8_4_ = iVar67 - open;
                    auVar70._12_4_ = iVar68 - open;
                    auVar63._0_4_ = iVar69 - gap;
                    auVar63._4_4_ = iVar71 - gap;
                    auVar63._8_4_ = iVar72 - gap;
                    auVar63._12_4_ = iVar73 - gap;
                    auVar39._0_4_ = -(uint)(auVar70._0_4_ < auVar63._0_4_);
                    auVar39._4_4_ = -(uint)(auVar70._4_4_ < auVar63._4_4_);
                    auVar39._8_4_ = -(uint)(auVar70._8_4_ < auVar63._8_4_);
                    auVar39._12_4_ = -(uint)(auVar70._12_4_ < auVar63._12_4_);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar29) =
                         ~auVar39 & auVar70 | auVar63 & auVar39;
                    auVar53._0_4_ = iVar11 - gap;
                    auVar53._4_4_ = iVar56 - gap;
                    auVar53._8_4_ = iVar57 - gap;
                    auVar53._12_4_ = iVar58 - gap;
                    auVar40._0_4_ = -(uint)(auVar70._0_4_ < auVar53._0_4_);
                    auVar40._4_4_ = -(uint)(auVar70._4_4_ < auVar53._4_4_);
                    auVar40._8_4_ = -(uint)(auVar70._8_4_ < auVar53._8_4_);
                    auVar40._12_4_ = -(uint)(auVar70._12_4_ < auVar53._12_4_);
                    auVar54 = auVar53 & auVar40 | ~auVar40 & auVar70;
                    auVar46 = *(undefined1 (*) [16])((long)*ptr + lVar29);
                    lVar29 = lVar29 + 0x10;
                  }
                  for (iVar28 = 0; iVar28 != 4; iVar28 = iVar28 + 1) {
                    iVar11 = iVar27;
                    if (s2_beg == 0) {
                      iVar11 = ptr_01[uVar22 + 1] - open;
                    }
                    auVar5._4_8_ = auVar54._8_8_;
                    auVar5._0_4_ = auVar54._0_4_;
                    auVar55._0_8_ = auVar5._0_8_ << 0x20;
                    auVar55._8_4_ = auVar54._4_4_;
                    auVar55._12_4_ = auVar54._8_4_;
                    auVar54._4_12_ = auVar55._4_12_;
                    auVar54._0_4_ = iVar11;
                    uVar23 = 0;
                    palVar15 = ptr_02;
                    while (uVar25 != uVar23) {
                      alVar65 = *palVar15;
                      auVar64._0_4_ = -(uint)(auVar54._0_4_ < (int)alVar65[0]);
                      iVar11 = auVar54._4_4_;
                      auVar64._4_4_ = -(uint)(iVar11 < alVar65[0]._4_4_);
                      iVar56 = auVar54._8_4_;
                      auVar64._8_4_ = -(uint)(iVar56 < (int)alVar65[1]);
                      iVar57 = auVar54._12_4_;
                      auVar64._12_4_ = -(uint)(iVar57 < alVar65[1]._4_4_);
                      alVar65 = (__m128i)(~auVar64 & auVar54 | (undefined1  [16])alVar65 & auVar64);
                      *palVar15 = alVar65;
                      iVar58 = (int)alVar65[0];
                      auVar41._0_4_ = -(uint)(iVar58 < auVar38._0_4_);
                      iVar61 = alVar65[0]._4_4_;
                      auVar41._4_4_ = -(uint)(iVar61 < auVar38._4_4_);
                      iVar66 = (int)alVar65[1];
                      auVar41._8_4_ = -(uint)(iVar66 < auVar38._8_4_);
                      iVar67 = alVar65[1]._4_4_;
                      auVar41._12_4_ = -(uint)(iVar67 < auVar38._12_4_);
                      auVar38 = ~auVar41 & auVar38 | (undefined1  [16])alVar65 & auVar41;
                      auVar49._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
                      auVar49._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
                      auVar49._8_4_ = -(uint)(iVar66 < auVar59._8_4_);
                      auVar49._12_4_ = -(uint)(iVar67 < auVar59._12_4_);
                      auVar59 = ~auVar49 & (undefined1  [16])alVar65 | auVar59 & auVar49;
                      vH[0] = uVar23 & 0xffffffff;
                      vH[1] = uVar25;
                      arr_store_si128(((ppVar14->field_4).rowcols)->score_row,vH,iVar21,s2Len,
                                      (int32_t)palVar30,in_stack_fffffffffffffe58);
                      auVar54._0_4_ = auVar54._0_4_ - gap;
                      auVar54._4_4_ = iVar11 - gap;
                      auVar54._8_4_ = iVar56 - gap;
                      auVar54._12_4_ = iVar57 - gap;
                      auVar42._0_4_ = -(uint)(iVar58 - open < auVar54._0_4_);
                      auVar42._4_4_ = -(uint)(iVar61 - open < auVar54._4_4_);
                      auVar42._8_4_ = -(uint)(iVar66 - open < auVar54._8_4_);
                      auVar42._12_4_ = -(uint)(iVar67 - open < auVar54._12_4_);
                      iVar11 = movmskps(extraout_EAX,auVar42);
                      uVar23 = uVar23 + 1;
                      palVar15 = palVar15 + 1;
                      if (iVar11 == 0) goto LAB_005649b6;
                    }
                  }
LAB_005649b6:
                  alVar65 = ptr_02[uVar33];
                  auVar50._0_4_ = -(uint)(auVar51._0_4_ < (int)alVar65[0]);
                  auVar50._4_4_ = -(uint)(auVar51._4_4_ < alVar65[0]._4_4_);
                  auVar50._8_4_ = -(uint)(auVar51._8_4_ < (int)alVar65[1]);
                  auVar50._12_4_ = -(uint)(auVar51._12_4_ < alVar65[1]._4_4_);
                  auVar6._4_4_ = -(uint)(iVar17 == 2);
                  auVar6._0_4_ = -(uint)(iVar17 == 3);
                  auVar6._8_4_ = -(uint)(iVar17 == 1);
                  auVar6._12_4_ = -(uint)(iVar12 == 3);
                  auVar48 = (undefined1  [16])alVar65 & auVar50;
                  auVar51 = ~auVar50 & auVar51 | auVar48;
                  iVar28 = movmskps((int)uVar33 * 0x10,auVar50 & auVar6);
                  if (iVar28 != 0) {
                    iVar16 = iVar21;
                  }
                  uVar22 = uVar22 + 1;
                  palVar15 = ptr;
                  ptr = ptr_02;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_striped_profile_sse2_128_32",pcVar20);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32_rpl(vH, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}